

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O2

SampledSpectrum __thiscall pbrt::LightHandle::Phi(LightHandle *this,SampledWavelengths *lambda)

{
  array<pbrt::Point3<float>,_4> *this_00;
  undefined8 uVar1;
  RGBColorSpace *pRVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  ulong uVar5;
  RGB *pRVar6;
  undefined1 auVar7 [8];
  uint uVar8;
  array<pbrt::WrapMode,_2> aVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  DistantLight *this_01;
  DiffuseAreaLight *this_02;
  GoniometricLight *this_03;
  undefined8 unaff_R14;
  Point2i PVar14;
  Float FVar15;
  undefined1 auVar33 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 extraout_var [60];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar45 [60];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 in_ZMM1 [64];
  Point3<float> PVar47;
  Vector3<float> VVar48;
  RGB RVar49;
  SampledSpectrum SVar50;
  undefined1 auStack_e8 [8];
  undefined1 auStack_e0 [8];
  RGB RStack_d8;
  PortalImageInfiniteLight *pPStack_c8;
  Transform *pTStack_c0;
  Bounds2<float> *pBStack_b8;
  SampledWavelengths *pSStack_b0;
  SampledWavelengths *pSStack_a8;
  ulong uStack_a0;
  undefined1 auStack_98 [8];
  WrapMode aWStack_90 [2];
  WrapMode2D WStack_88;
  RGBIlluminantSpectrum RStack_80;
  SampledSpectrum SStack_68;
  SampledSpectrum SStack_58;
  undefined1 auStack_48 [16];
  DenselySampledSpectrum *pDStack_38;
  float fStack_18;
  Float FStack_14;
  undefined1 extraout_var_00 [56];
  undefined1 auVar46 [56];
  
  auVar46 = in_ZMM1._8_56_;
  uVar5 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar4 = (ushort)(uVar5 >> 0x30);
  uVar8 = (uint)uVar4;
  fStack_18 = (float)unaff_R14;
  FStack_14 = (Float)((ulong)unaff_R14 >> 0x20);
  if (4 < uVar5 >> 0x30) {
    uVar10 = uVar4 - 4;
    if (uVar10 < 3) {
      this_02 = (DiffuseAreaLight *)(uVar5 & 0xffffffffffff);
      if (uVar10 == 2) {
        SVar50 = DiffuseAreaLight::Phi(this_02,lambda);
        return (array<float,_4>)(array<float,_4>)SVar50;
      }
      auVar33 = (undefined1  [56])0x0;
      SStack_68.values.values[2] = 5.356536e-39;
      SStack_68.values.values[3] = 0.0;
      SStack_58.values.values[3] = *(Float *)&(this_02->Lemit).values.nAlloc;
      SVar50 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)&this_02->shape,lambda);
      auVar41._0_8_ = SVar50.values.values._8_8_;
      auVar41._8_56_ = auVar46;
      auVar29._0_8_ = SVar50.values.values._0_8_;
      auVar29._8_56_ = auVar33;
      auVar35 = vmovlhps_avx(auVar29._0_16_,auVar41._0_16_);
      auStack_48._0_8_ = auVar35._0_8_;
      auStack_48._8_8_ = auVar35._8_8_;
      auVar33 = (undefined1  [56])0x0;
      SStack_68.values.values[2] = 5.35657e-39;
      SStack_68.values.values[3] = 0.0;
      SVar50 = SampledSpectrum::operator*((SampledSpectrum *)auStack_48,SStack_58.values.values[3]);
      auVar42._0_8_ = SVar50.values.values._8_8_;
      auVar42._8_56_ = auVar46;
      auVar30._0_8_ = SVar50.values.values._0_8_;
      auVar30._8_56_ = auVar33;
      auVar35 = vmovlhps_avx(auVar30._0_16_,auVar42._0_16_);
      pDStack_38 = auVar35._0_8_;
      auVar33 = (undefined1  [56])0x0;
      SStack_68.values.values[2] = 5.356606e-39;
      SStack_68.values.values[3] = 0.0;
      SVar50 = SampledSpectrum::operator*((SampledSpectrum *)&pDStack_38,2.0);
      auVar43._0_8_ = SVar50.values.values._8_8_;
      auVar43._8_56_ = auVar46;
      auVar31._0_8_ = SVar50.values.values._0_8_;
      auVar31._8_56_ = auVar33;
      vmovlhps_avx(auVar31._0_16_,auVar43._0_16_);
      auVar33 = (undefined1  [56])0x0;
      SStack_68.values.values[2] = 5.356643e-39;
      SStack_68.values.values[3] = 0.0;
      SVar50 = SampledSpectrum::operator*((SampledSpectrum *)&stack0xffffffffffffffd8,3.1415927);
      auVar44._0_8_ = SVar50.values.values._8_8_;
      auVar44._8_56_ = auVar46;
      auVar32._0_8_ = SVar50.values.values._0_8_;
      auVar32._8_56_ = auVar33;
      auVar35 = vmovlhps_avx(auVar32._0_16_,auVar44._0_16_);
      fStack_18 = auVar35._0_4_;
      FStack_14 = auVar35._4_4_;
      fVar34 = *(float *)((long)&(this_02->Lemit).values.nAlloc + 4);
      SStack_68.values.values[2] = 5.356724e-39;
      SStack_68.values.values[3] = 0.0;
      SVar50 = SampledSpectrum::operator*
                         ((SampledSpectrum *)&fStack_18,
                          (1.0 - fVar34) +
                          (fVar34 - *(float *)&(this_02->Lemit).values.nStored) * 0.5);
      return (array<float,_4>)(array<float,_4>)SVar50;
    }
    pPStack_c8 = (PortalImageInfiniteLight *)(uVar5 & 0xffffffffffff);
    if (uVar8 - 6 < 2) {
      fVar34 = (pPStack_c8->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z;
      FStack_14 = fVar34 * fVar34 * 39.47842 *
                  (pPStack_c8->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y;
      auVar33 = (undefined1  [56])0x0;
      SVar50 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)&pPStack_c8->portal,lambda);
      auVar39._0_8_ = SVar50.values.values._8_8_;
      auVar39._8_56_ = auVar46;
      auVar24._0_8_ = SVar50.values.values._0_8_;
      auVar24._8_56_ = auVar33;
      vmovlhps_avx(auVar24._0_16_,auVar39._0_16_);
      SVar50 = SampledSpectrum::operator*((SampledSpectrum *)&stack0xfffffffffffffff0,FStack_14);
      return (array<float,_4>)(array<float,_4>)SVar50;
    }
    if (uVar8 - 6 != 2) {
      SVar50 = PortalImageInfiniteLight::Phi(pPStack_c8,lambda);
      return (array<float,_4>)(array<float,_4>)SVar50;
    }
    auVar25 = ZEXT1264(ZEXT812(0));
    auStack_e0._0_4_ = 5.346664e-39;
    auStack_e0._4_4_ = 0.0;
    pSStack_a8 = lambda;
    SampledSpectrum::SampledSpectrum(&SStack_68,0.0);
    pBStack_b8._0_4_ = (int)(pPStack_c8->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
    pBStack_b8._4_4_ = (pPStack_c8->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
    this_00 = &pPStack_c8->portal;
    pTStack_c0 = (Transform *)((ulong)pBStack_b8 >> 0x20);
    aWStack_90[0] = ~((int)pBStack_b8 >> 0x1f) & (int)pBStack_b8;
    aWStack_90[1] = 0;
    pSStack_b0 = (SampledWavelengths *)
                 (ulong)(uint)(~((int)pBStack_b8._4_4_ >> 0x1f) & pBStack_b8._4_4_);
    for (auVar7 = (undefined1  [8])0x0; auVar46 = in_ZMM1._8_56_,
        auVar7 != (undefined1  [8])pSStack_b0; auVar7 = (undefined1  [8])((long)auVar7 + 1)) {
      uStack_a0 = (long)auVar7 << 0x20;
      auStack_98 = auVar7;
      aVar9.values[0] = Repeat;
      aVar9.values[1] = Repeat;
      while (aVar9.values != aWStack_90) {
        RStack_d8.r = 0.0;
        RStack_d8.g = 0.0;
        RStack_d8.b = 0.0;
        iVar12 = 0;
        PVar14.super_Tuple2<pbrt::Point2,_int> =
             (Tuple2<pbrt::Point2,_int>)(uStack_a0 | (ulong)aVar9.values);
        WStack_88.wrap.values = (array<pbrt::WrapMode,_2>)(array<pbrt::WrapMode,_2>)aVar9.values;
        while( true ) {
          auVar33 = in_ZMM1._8_56_;
          auVar46 = auVar25._8_56_;
          if (iVar12 == 3) break;
          auStack_e0._0_4_ = 5.346891e-39;
          auStack_e0._4_4_ = 0.0;
          WrapMode2D::WrapMode2D((WrapMode2D *)((long)&RStack_80 + 0x10),OctahedralSphere);
          auStack_e0._0_4_ = 5.346916e-39;
          auStack_e0._4_4_ = 0.0;
          auVar25._0_4_ =
               Image::GetChannel((Image *)this_00,PVar14,iVar12,(WrapMode2D)RStack_80.illuminant);
          auVar25._4_60_ = extraout_var;
          pRVar6 = &RStack_d8;
          if ((iVar12 != 0) && (pRVar6 = (RGB *)&RStack_d8.g, iVar12 != 1)) {
            pRVar6 = (RGB *)&RStack_d8.b;
          }
          pRVar6->r = auVar25._0_4_;
          iVar12 = iVar12 + 1;
        }
        pRVar2 = (RGBColorSpace *)(pPStack_c8->image).p8.ptr;
        auStack_e0._0_4_ = 5.346986e-39;
        auStack_e0._4_4_ = 0.0;
        RVar49 = ClampZero(&RStack_d8);
        auVar26._0_8_ = RVar49._0_8_;
        auVar26._8_56_ = auVar46;
        uVar1 = vmovlps_avx(auVar26._0_16_);
        RStack_80.rsp.c1 = RVar49.b;
        RStack_80._0_8_ = uVar1;
        auStack_e0._0_4_ = 5.347037e-39;
        auStack_e0._4_4_ = 0.0;
        RGBIlluminantSpectrum::RGBIlluminantSpectrum
                  ((RGBIlluminantSpectrum *)auStack_48,pRVar2,(RGB *)&RStack_80);
        auStack_e0._0_4_ = 5.347055e-39;
        auStack_e0._4_4_ = 0.0;
        SVar50 = RGBIlluminantSpectrum::Sample((RGBIlluminantSpectrum *)auStack_48,pSStack_a8);
        in_ZMM1._0_8_ = SVar50.values.values._8_8_;
        in_ZMM1._8_56_ = auVar33;
        auVar27._0_8_ = SVar50.values.values._0_8_;
        auVar27._8_56_ = auVar46;
        SStack_58.values.values = (array<float,_4>)vmovlhps_avx(auVar27._0_16_,in_ZMM1._0_16_);
        auVar25 = ZEXT1664((undefined1  [16])SStack_58.values.values);
        auStack_e0._0_4_ = 5.347099e-39;
        auStack_e0._4_4_ = 0.0;
        SampledSpectrum::operator+=(&SStack_68,&SStack_58);
        auVar7 = auStack_98;
        aVar9 = WStack_88.wrap.values + 1;
      }
    }
    fVar34 = *(float *)&(pPStack_c8->image).p16.alloc.memoryResource;
    auVar33 = (undefined1  [56])0x0;
    auStack_e0._0_4_ = 5.347195e-39;
    auStack_e0._4_4_ = 0.0;
    SVar50 = SampledSpectrum::operator*
                       (&SStack_68,
                        fVar34 * fVar34 * 39.47842 * *(float *)&(pPStack_c8->image).p8.nAlloc);
    auVar40._0_8_ = SVar50.values.values._8_8_;
    auVar40._8_56_ = auVar46;
    auVar28._0_8_ = SVar50.values.values._0_8_;
    auVar28._8_56_ = auVar33;
    auVar35 = vmovlhps_avx(auVar28._0_16_,auVar40._0_16_);
    auStack_48._0_8_ = auVar35._0_8_;
    auStack_48._8_8_ = auVar35._8_8_;
    auStack_e0._0_4_ = 5.347244e-39;
    auStack_e0._4_4_ = 0.0;
    SVar50 = SampledSpectrum::operator/
                       ((SampledSpectrum *)auStack_48,(float)((int)pTStack_c0 * (int)pBStack_b8));
    return (array<float,_4>)(array<float,_4>)SVar50;
  }
  if (2 < uVar8) {
    this_03 = (GoniometricLight *)(uVar5 & 0xffffffffffff);
    if ((uVar8 & 6) != 2) {
      SVar50 = GoniometricLight::Phi(this_03,lambda);
      return (array<float,_4>)(array<float,_4>)SVar50;
    }
    pSStack_b0 = lambda;
    SampledSpectrum::SampledSpectrum(&SStack_68,0.0);
    pBStack_b8 = (Bounds2<float> *)((long)&(this_03->image).p16.nStored + 4);
    pTStack_c0 = (Transform *)&(this_03->distrib).pMarginal.min;
    uVar5 = *(ulong *)&(this_03->Iemit).lambda_max;
    lVar11 = 0;
    while (auVar46 = in_ZMM1._8_56_, lVar11 < (long)uVar5 >> 0x20) {
      pSStack_a8 = (SampledWavelengths *)(lVar11 << 0x20);
      SStack_58.values.values = (array<float,_4>)ZEXT416((uint)((float)(int)lVar11 + 0.5));
      uVar13 = 0;
      pPStack_c8 = (PortalImageInfiniteLight *)lVar11;
      while ((long)uVar13 < (long)(int)uVar5) {
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar5;
        auVar35 = vcvtdq2ps_avx(auVar35);
        auVar45 = ZEXT1260(auVar35._4_12_);
        auVar3 = vinsertps_avx(ZEXT416((uint)((float)(int)uVar13 + 0.5)),
                               ZEXT416((uint)SStack_58.values.values[0]),0x10);
        auVar35 = vdivps_avx(auVar3,auVar35);
        auVar17._0_8_ = Bounds2<float>::Lerp(pBStack_b8,auVar35._0_8_);
        auVar17._8_56_ = extraout_var_00;
        uVar5 = vmovlps_avx(auVar17._0_16_);
        RStack_80.rsp.c1 = 0.0;
        RStack_80._0_8_ = uVar5;
        auVar46 = extraout_var_00;
        PVar47 = Transform::operator()(pTStack_c0,(Point3<float> *)&RStack_80);
        RStack_d8.b = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
        auVar18._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar18._8_56_ = auVar46;
        RStack_d8._0_8_ = vmovlps_avx(auVar18._0_16_);
        VVar48 = Normalize<float>((Vector3<float> *)&RStack_d8);
        fVar34 = VVar48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar19._0_8_ = VVar48.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar19._8_56_ = auVar46;
        auStack_e8._0_4_ = 0.0;
        auStack_e8._4_4_ = 0.0;
        auStack_e0 = (undefined1  [8])((ulong)auStack_e0 & 0xffffffff00000000);
        RStack_d8._0_8_ = vmovlps_avx(auVar19._0_16_);
        PVar14.super_Tuple2<pbrt::Point2,_int> =
             (Tuple2<pbrt::Point2,_int>)((ulong)pSStack_a8 | uVar13);
        RStack_d8.b = fVar34;
        uStack_a0 = uVar13;
        for (iVar12 = 0; auVar46 = auVar45._4_56_, iVar12 != 3; iVar12 = iVar12 + 1) {
          WrapMode2D::WrapMode2D(&WStack_88,Clamp);
          FVar15 = Image::GetChannel((Image *)&this_03->Iemit,PVar14,iVar12,WStack_88);
          pRVar6 = (RGB *)auStack_e8;
          if ((iVar12 != 0) && (pRVar6 = (RGB *)(auStack_e8 + 4), iVar12 != 1)) {
            pRVar6 = (RGB *)auStack_e0;
          }
          pRVar6->r = FVar15;
        }
        auVar33 = (undefined1  [56])0x0;
        pRVar2 = (RGBColorSpace *)(this_03->image).p16.nAlloc;
        RVar49 = ClampZero((RGB *)auStack_e8);
        auVar20._0_8_ = RVar49._0_8_;
        auVar20._8_56_ = auVar33;
        uVar1 = vmovlps_avx(auVar20._0_16_);
        aWStack_90[0] = (WrapMode)RVar49.b;
        auStack_98 = (undefined1  [8])uVar1;
        RGBIlluminantSpectrum::RGBIlluminantSpectrum(&RStack_80,pRVar2,(RGB *)auStack_98);
        SVar50 = RGBIlluminantSpectrum::Sample(&RStack_80,pSStack_b0);
        auVar37._0_8_ = SVar50.values.values._8_8_;
        auVar37._8_56_ = auVar46;
        auVar21._0_8_ = SVar50.values.values._0_8_;
        auVar21._8_56_ = auVar33;
        auVar35 = vmovlhps_avx(auVar21._0_16_,auVar37._0_16_);
        auStack_48._8_8_ = auVar35._0_8_;
        pDStack_38 = auVar35._8_8_;
        auVar33 = (undefined1  [56])0x0;
        SVar50 = SampledSpectrum::operator*
                           ((SampledSpectrum *)(auStack_48 + 8),fVar34 * fVar34 * fVar34);
        in_ZMM1._0_8_ = SVar50.values.values._8_8_;
        in_ZMM1._8_56_ = auVar46;
        auVar22._0_8_ = SVar50.values.values._0_8_;
        auVar22._8_56_ = auVar33;
        _auStack_98 = vmovlhps_avx(auVar22._0_16_,in_ZMM1._0_16_);
        SampledSpectrum::operator+=(&SStack_68,(SampledSpectrum *)auStack_98);
        uVar5 = *(ulong *)&(this_03->Iemit).lambda_max;
        uVar13 = uStack_a0 + 1;
      }
      lVar11 = (long)pPStack_c8 + 1;
    }
    auVar33 = (undefined1  [56])0x0;
    SVar50 = SampledSpectrum::operator*
                       (&SStack_68,
                        *(float *)&(this_03->image).p16.nStored *
                        this_03[1].super_LightBase.renderFromLight.mInv.m[2][3]);
    auVar38._0_8_ = SVar50.values.values._8_8_;
    auVar38._8_56_ = auVar46;
    auVar23._0_8_ = SVar50.values.values._0_8_;
    auVar23._8_56_ = auVar33;
    RStack_80._0_16_ = vmovlhps_avx(auVar23._0_16_,auVar38._0_16_);
    uVar1 = *(undefined8 *)&(this_03->Iemit).lambda_max;
    SVar50 = SampledSpectrum::operator/
                       ((SampledSpectrum *)&RStack_80,
                        (float)((int)((ulong)uVar1 >> 0x20) * (int)uVar1));
    return (array<float,_4>)(array<float,_4>)SVar50;
  }
  this_01 = (DistantLight *)(uVar5 & 0xffffffffffff);
  if (uVar8 == 2) {
    SVar50 = DistantLight::Phi(this_01,lambda);
    return (array<float,_4>)(array<float,_4>)SVar50;
  }
  FStack_14 = this_01->scale * 12.566371;
  auVar33 = (undefined1  [56])0x0;
  SVar50 = DenselySampledSpectrum::Sample(&this_01->Lemit,lambda);
  auVar36._0_8_ = SVar50.values.values._8_8_;
  auVar36._8_56_ = auVar46;
  auVar16._0_8_ = SVar50.values.values._0_8_;
  auVar16._8_56_ = auVar33;
  vmovlhps_avx(auVar16._0_16_,auVar36._0_16_);
  SVar50 = SampledSpectrum::operator*((SampledSpectrum *)&stack0xfffffffffffffff0,FStack_14);
  return (array<float,_4>)(array<float,_4>)SVar50;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }